

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O0

base_learner * lrq_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  bool bVar3;
  pointer pLVar4;
  string *psVar5;
  reference this;
  ulong uVar6;
  reference pbVar7;
  undefined8 uVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  uint *puVar12;
  base_learner *base;
  learner<LRQstate,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<LRQstate,_example> *l;
  uint k;
  stringstream __msg;
  string *i_1;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t i;
  uint32_t maxk;
  option_group_definition new_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lrq_names;
  free_ptr<LRQstate> lrq;
  string *in_stack_fffffffffffffa48;
  vw *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  single_learner *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  learner<LRQstate,_example> *in_stack_fffffffffffffa70;
  int plineNumber;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa80;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa98;
  option_group_definition *in_stack_fffffffffffffaa0;
  string *arg;
  uint local_4c8;
  undefined1 local_4c1;
  stringstream local_4a0 [16];
  stringstream local_490 [160];
  learner<char,_char> *in_stack_fffffffffffffc10;
  _Self local_310;
  _Self local_308;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  string local_2e8 [32];
  string *local_2c8;
  uint local_2bc [2];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  typed_option<bool> local_240;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  learner<LRQstate,_example> local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<LRQstate>();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x41c921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Low Rank Quadratics",&local_99);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"lrq",&local_171);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffa58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa50);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_150,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"use low rank quadratic features",&local_199);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"lrqdropout",&local_261);
  std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
            ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41caa4);
  VW::config::make_option<bool>(in_stack_fffffffffffffa58,(bool *)in_stack_fffffffffffffa50);
  VW::config::typed_option<bool>::keep(&local_240,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,"use dropout training for low rank quadratic features",&local_289);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffaa0,(typed_option<bool> *)in_stack_fffffffffffffa98);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  (**(code **)*local_10)(local_10,local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"lrq",&local_2b1);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_2b0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  pvVar1 = local_18;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    local_2bc[0] = 0;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41cee4);
    pLVar4->all = pvVar1;
    local_2c8 = (string *)0x0;
    while (arg = local_2c8,
          psVar5 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_40), arg < psVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_40,(size_type)local_2c8);
      spoof_hex_encoded_namespaces(arg);
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_40,(size_type)local_2c8);
      std::__cxx11::string::operator=((string *)this,local_2e8);
      std::__cxx11::string::~string(local_2e8);
      local_2c8 = (string *)&local_2c8->field_0x1;
    }
    std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41cf9e);
    local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa48);
    local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa48);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    uVar6 = local_18->random_seed | 0x845fed;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d018);
    pLVar4->seed = uVar6;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d031);
    pLVar4->initial_seed = uVar6;
    if ((local_18->quiet & 1U) == 0) {
      std::operator<<(&(local_18->trace_message).super_ostream,
                      "creating low rank quadratic features for pairs: ");
      pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                         ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d078);
      if ((pLVar4->dropout & 1U) != 0) {
        std::operator<<(&(local_18->trace_message).super_ostream,"(using dropout) ");
      }
    }
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d0af);
    local_300 = &pLVar4->lrpairs;
    local_308._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa48);
    local_310._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffa48);
    while (bVar3 = std::operator!=(&local_308,&local_310), bVar3) {
      pbVar7 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x41d112);
      plineNumber = (int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
      if ((local_18->quiet & 1U) == 0) {
        uVar6 = std::__cxx11::string::length();
        if (uVar6 < 3) {
LAB_0041d163:
          std::__cxx11::stringstream::stringstream(local_4a0);
          std::operator<<((ostream *)(local_4a0 + 0x10),
                          "error, low-rank quadratic features must involve two sets and a rank.");
          local_4c1 = 1;
          uVar8 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    ((vw_exception *)in_stack_fffffffffffffa80._M_current,
                     (char *)in_stack_fffffffffffffa78._M_current,plineNumber,
                     in_stack_fffffffffffffa68);
          local_4c1 = 0;
          __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        std::__cxx11::string::c_str();
        bVar3 = valid_int((char *)in_stack_fffffffffffffa50);
        if (!bVar3) goto LAB_0041d163;
        poVar9 = std::operator<<(&(local_18->trace_message).super_ostream,(string *)pbVar7);
        std::operator<<(poVar9," ");
      }
      lVar10 = std::__cxx11::string::c_str();
      local_4c8 = atoi((char *)(lVar10 + 2));
      in_stack_fffffffffffffa70 = local_28;
      in_stack_fffffffffffffa78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                     ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d2dc);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar7);
      ((pointer)in_stack_fffffffffffffa78._M_current)->lrindices[*pcVar11] = true;
      in_stack_fffffffffffffa80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                     ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x41d30d);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar7);
      ((pointer)in_stack_fffffffffffffa80._M_current)->lrindices[*pcVar11] = true;
      puVar12 = std::max<unsigned_int>(local_2bc,&local_4c8);
      local_2bc[0] = *puVar12;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa50);
    }
    if ((local_18->quiet & 1U) == 0) {
      std::ostream::operator<<(&local_18->trace_message,std::endl<char,std::char_traits<char>>);
    }
    local_18->wpp = local_18->wpp * (local_2bc[0] + 1);
    base = setup_base((options_i *)in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    in_stack_fffffffffffffa60 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffc10);
    base_00 = LEARNER::init_learner<LRQstate,example,LEARNER::learner<char,example>>
                        ((free_ptr<LRQstate> *)in_stack_fffffffffffffa70,
                         (learner<char,_example> *)base,
                         (_func_void_LRQstate_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffa60,
                         (_func_void_LRQstate_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    LEARNER::learner<LRQstate,_example>::set_end_pass
              (in_stack_fffffffffffffa70,(_func_void_LRQstate_ptr *)base);
    LEARNER::learner<LRQstate,_example>::set_finish
              (in_stack_fffffffffffffa70,(_func_void_LRQstate_ptr *)base);
    in_stack_fffffffffffffa50 = (vw *)LEARNER::make_base<LRQstate,example>(base_00);
    local_8 = in_stack_fffffffffffffa50;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_2bc[1] = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa60);
  std::unique_ptr<LRQstate,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<LRQstate,_void_(*)(void_*)> *)in_stack_fffffffffffffa60);
  return (base_learner *)local_8;
}

Assistant:

base_learner* lrq_setup(options_i& options, vw& all)
{
  auto lrq = scoped_calloc_or_throw<LRQstate>();
  vector<string> lrq_names;
  option_group_definition new_options("Low Rank Quadratics");
  new_options.add(make_option("lrq", lrq_names).keep().help("use low rank quadratic features"))
      .add(make_option("lrqdropout", lrq->dropout).keep().help("use dropout training for low rank quadratic features"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrq"))
    return nullptr;

  uint32_t maxk = 0;
  lrq->all = &all;

  for (size_t i = 0; i < lrq_names.size(); i++) lrq_names[i] = spoof_hex_encoded_namespaces(lrq_names[i]);

  new (&lrq->lrpairs) std::set<std::string>(lrq_names.begin(), lrq_names.end());

  lrq->initial_seed = lrq->seed = all.random_seed | 8675309;

  if (!all.quiet)
  {
    all.trace_message << "creating low rank quadratic features for pairs: ";
    if (lrq->dropout)
      all.trace_message << "(using dropout) ";
  }

  for (string const& i : lrq->lrpairs)
  {
    if (!all.quiet)
    {
      if ((i.length() < 3) || !valid_int(i.c_str() + 2))
        THROW("error, low-rank quadratic features must involve two sets and a rank.");

      all.trace_message << i << " ";
    }
    // TODO: colon-syntax

    unsigned int k = atoi(i.c_str() + 2);

    lrq->lrindices[(int)i[0]] = 1;
    lrq->lrindices[(int)i[1]] = 1;

    maxk = max(maxk, k);
  }

  if (!all.quiet)
    all.trace_message << endl;

  all.wpp = all.wpp * (uint64_t)(1 + maxk);
  learner<LRQstate, example>& l = init_learner(
      lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, 1 + maxk);
  l.set_end_pass(reset_seed);
  l.set_finish(finish);

  // TODO: leaks memory ?
  return make_base(l);
}